

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-utils.h
# Opt level: O1

bool __thiscall
wasm::BranchUtils::BranchSeeker::has(BranchSeeker *this,Expression *tree,Name target)

{
  bool bVar1;
  undefined1 auStack_148 [8];
  BranchSeeker seeker;
  Expression *tree_local;
  
  seeker.target.super_IString.str._M_len = target.super_IString.str._M_len;
  if (seeker.target.super_IString.str._M_len == 0) {
    bVar1 = false;
  }
  else {
    seeker._232_8_ = &seeker.types._M_h._M_rehash_policy._M_next_resize;
    auStack_148 = (undefined1  [8])0x0;
    seeker.
    super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
    .
    super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
    .replacep = (Expression **)0x0;
    seeker.
    super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
    .
    super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
    .stack.fixed._M_elems[9].currp = (Expression **)0x0;
    seeker.
    super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
    .
    super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    seeker.
    super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
    .
    super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    seeker.
    super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
    .
    super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    seeker.
    super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
    .
    super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
    .currFunction = (Function *)0x0;
    seeker.target.super_IString.str._M_str._0_4_ = 0;
    seeker.types._M_h._M_buckets = (__buckets_ptr)0x1;
    seeker.types._M_h._M_bucket_count = 0;
    seeker.types._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    seeker.types._M_h._M_element_count._0_4_ = 0x3f800000;
    seeker.types._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    seeker.types._M_h._M_rehash_policy._4_4_ = 0;
    seeker.types._M_h._M_rehash_policy._M_next_resize = 0;
    seeker.
    super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
    .
    super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
    .currModule = (Module *)tree;
    seeker.types._M_h._M_single_bucket = (__node_base_ptr)this;
    Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
    ::walk((Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
            *)auStack_148,(Expression **)&seeker.types._M_h._M_single_bucket);
    bVar1 = (int)seeker.target.super_IString.str._M_str != 0;
    std::
    _Hashtable<wasm::Type,_wasm::Type,_std::allocator<wasm::Type>,_std::__detail::_Identity,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<wasm::Type,_wasm::Type,_std::allocator<wasm::Type>,_std::__detail::_Identity,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)&seeker.found);
    if (seeker.
        super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
        .
        super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
        .stack.fixed._M_elems[9].currp != (Expression **)0x0) {
      operator_delete(seeker.
                      super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                      .
                      super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                      .stack.fixed._M_elems[9].currp,
                      (long)seeker.
                            super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                            .
                            super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                            .stack.flexible.
                            super__Vector_base<wasm::Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>::Task,_std::allocator<wasm::Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>::Task>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)seeker.
                            super_PostWalker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                            .
                            super_Walker<wasm::BranchUtils::BranchSeeker,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchSeeker,_void>_>
                            .stack.fixed._M_elems[9].currp);
    }
  }
  return bVar1;
}

Assistant:

static bool has(Expression* tree, Name target) {
    if (!target.is()) {
      return false;
    }
    BranchSeeker seeker(target);
    seeker.walk(tree);
    return seeker.found > 0;
  }